

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void RenderLoop(void)

{
  long lVar1;
  long lVar2;
  double dVar3;
  Camera *pCVar4;
  PFNGLUNIFORM1IPROC p_Var5;
  PFNGLUNIFORM3FVPROC p_Var6;
  GLenum GVar7;
  GLint GVar8;
  ostream *poVar9;
  int iVar10;
  allocator<char> local_3d1;
  GLuint headPtrTex;
  GLuint multisampledFBO;
  allocator<char> local_3c5;
  GLuint buffers [2];
  GLuint multisampleTex;
  string local_3b8;
  col_type local_398;
  col_type local_388;
  float local_378;
  GLuint multisampleDepth;
  Shader postProcessingShader;
  GLuint zero;
  Shader transparentShader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> headPtrClear;
  mat4 view;
  Shader opaqueShader;
  mat4 pre_view;
  mat4 projection;
  Model glTF_model;
  
  (*glad_glGenFramebuffers)(1,&multisampledFBO);
  (*glad_glBindFramebuffer)(0x8d40,multisampledFBO);
  (*glad_glGenTextures)(1,&multisampleTex);
  (*glad_glBindTexture)(0x9100,multisampleTex);
  (*glad_glTexImage2DMultisample)
            (0x9100,4,0x8814,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,'\x01');
  (*glad_glBindTexture)(0x9100,0);
  (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0x9100,multisampleTex,0);
  (*glad_glGenRenderbuffers)(1,&multisampleDepth);
  (*glad_glBindRenderbuffer)(0x8d41,multisampleDepth);
  (*glad_glRenderbufferStorageMultisample)
            (0x8d41,4,0x88f0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT);
  (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,multisampleDepth);
  GVar7 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar7 != 0x8cd5) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Framebuffer not complete!");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  iVar10 = WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT;
  (*glad_glGenBuffers)(2,buffers);
  (*glad_glBindBuffer)(0x92c0,buffers[0]);
  (*glad_glBufferData)(0x92c0,4,(void *)0x0,0x88e8);
  (*glad_glBindBuffer)(0x90d2,buffers[1]);
  (*glad_glBufferData)(0x90d2,(ulong)(uint)(iVar10 * 0x180),(void *)0x0,0x88e8);
  (*glad_glGenTextures)(1,&headPtrTex);
  (*glad_glBindTexture)(0xde1,headPtrTex);
  (*glad_glTexStorage2D)(0xde1,1,0x8236,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT);
  glTF_model.transparent_queue.c.
  super__Vector_base<std::pair<float,_Model::RenderDependence>,_std::allocator<std::pair<float,_Model::RenderDependence>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&headPtrClear,(long)WindowConfig::SCR_HEIGHT * (long)WindowConfig::SCR_WIDTH,
             (value_type_conflict3 *)&glTF_model,(allocator_type *)&opaqueShader);
  glm::perspectiveRH_NO<float>
            (&projection,WindowConfig::mainCamera->Zoom,
             (float)WindowConfig::SCR_WIDTH / (float)WindowConfig::SCR_HEIGHT,0.01,1000.0);
  Model::Model(&glTF_model,&glTF_model_path_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transparentShader,"../shaders/skin/opaque.vert",
             (allocator<char> *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postProcessingShader,"../shaders/skin/opaque.frag",(allocator<char> *)&zero)
  ;
  Shader::Shader(&opaqueShader,(string *)&transparentShader,(string *)&postProcessingShader);
  std::__cxx11::string::~string((string *)&postProcessingShader);
  std::__cxx11::string::~string((string *)&transparentShader);
  Shader::Use(&opaqueShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transparentShader,"projection",(allocator<char> *)&postProcessingShader);
  Shader::setMat4(&opaqueShader,(string *)&transparentShader,&projection);
  std::__cxx11::string::~string((string *)&transparentShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postProcessingShader,"../shaders/skin/transparent.vert",
             (allocator<char> *)&zero);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"../shaders/skin/transparent.frag",&local_3d1);
  Shader::Shader(&transparentShader,(string *)&postProcessingShader,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&postProcessingShader);
  Shader::Use(&transparentShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postProcessingShader,"MAX_NODES",(allocator<char> *)&local_3b8);
  p_Var5 = glad_glUniform1i;
  GVar8 = (*glad_glGetUniformLocation)
                    (transparentShader.Program,
                     (GLchar *)CONCAT44(postProcessingShader._4_4_,postProcessingShader.Program));
  iVar10 = iVar10 * 0x10;
  (*p_Var5)(GVar8,iVar10);
  std::__cxx11::string::~string((string *)&postProcessingShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postProcessingShader,"projection",(allocator<char> *)&local_3b8);
  Shader::setMat4(&transparentShader,(string *)&postProcessingShader,&projection);
  std::__cxx11::string::~string((string *)&postProcessingShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"../shaders/skin/postprocessing.vert",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&zero,"../shaders/skin/postprocessing.frag",&local_3c5);
  Shader::Shader(&postProcessingShader,&local_3b8,(string *)&zero);
  std::__cxx11::string::~string((string *)&zero);
  std::__cxx11::string::~string((string *)&local_3b8);
  Shader::Use(&postProcessingShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"MAX_NODES",(allocator<char> *)&zero);
  p_Var5 = glad_glUniform1i;
  GVar8 = (*glad_glGetUniformLocation)(postProcessingShader.Program,local_3b8._M_dataplus._M_p);
  (*p_Var5)(GVar8,iVar10);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"colorTextureMS",(allocator<char> *)&zero);
  p_Var5 = glad_glUniform1i;
  GVar8 = (*glad_glGetUniformLocation)(postProcessingShader.Program,local_3b8._M_dataplus._M_p);
  (*p_Var5)(GVar8,0);
  std::__cxx11::string::~string((string *)&local_3b8);
  while( true ) {
    GVar7 = (*glad_glGetError)();
    if (GVar7 == 0) break;
    poVar9 = std::operator<<((ostream *)&std::cout,"Before Start");
    lVar1 = *(long *)poVar9;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar9 + lVar2 + 0x18) = *(uint *)(poVar9 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar9 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(lVar1 + -0x18) + 0x18) | 0x200;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  while( true ) {
    iVar10 = glfwWindowShouldClose(WindowConfig::window);
    if (iVar10 != 0) break;
    dVar3 = glfwGetTime();
    local_378 = (float)dVar3;
    RenderLoop::deltaTime = local_378 - RenderLoop::lastFrame;
    RenderLoop::lastFrame = local_378;
    glfwPollEvents();
    Controller::Movement((double)RenderLoop::deltaTime);
    pre_view.value[3].field_0 = view.value[3].field_0;
    pre_view.value[3].field_1 = view.value[3].field_1;
    pre_view.value[3].field_2 = view.value[3].field_2;
    pre_view.value[3].field_3 = view.value[3].field_3;
    pre_view.value[2].field_0 = view.value[2].field_0;
    pre_view.value[2].field_1 = view.value[2].field_1;
    pre_view.value[2].field_2 = view.value[2].field_2;
    pre_view.value[2].field_3 = view.value[2].field_3;
    pre_view.value[1].field_0 = view.value[1].field_0;
    pre_view.value[1].field_1 = view.value[1].field_1;
    pre_view.value[1].field_2 = view.value[1].field_2;
    pre_view.value[1].field_3 = view.value[1].field_3;
    pre_view.value[0].field_0 = view.value[0].field_0;
    pre_view.value[0].field_1 = view.value[0].field_1;
    pre_view.value[0].field_2 = view.value[0].field_2;
    pre_view.value[0].field_3 = view.value[0].field_3;
    Camera::GetViewMatrix((mat4 *)&local_3b8,WindowConfig::mainCamera);
    view.value[3].field_0 = local_388.field_0;
    view.value[3].field_1 = local_388.field_1;
    view.value[3].field_2 = local_388.field_2;
    view.value[3].field_3 = local_388.field_3;
    view.value[2].field_0 = local_398.field_0;
    view.value[2].field_1 = local_398.field_1;
    view.value[2].field_2 = local_398.field_2;
    view.value[2].field_3 = local_398.field_3;
    view.value[1].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         local_3b8.field_2._M_allocated_capacity._0_4_;
    view.value[1].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         local_3b8.field_2._M_allocated_capacity._4_4_;
    view.value[1].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_3b8.field_2._8_4_;
    view.value[1].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_3b8.field_2._12_4_;
    view.value[0]._0_8_ = local_3b8._M_dataplus._M_p;
    view.value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         (undefined4)local_3b8._M_string_length;
    view.value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         local_3b8._M_string_length._4_4_;
    (*glad_glBindFramebuffer)(0x8d40,multisampledFBO);
    (*glad_glClear)(0x4100);
    Shader::Use(&opaqueShader);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"view",(allocator<char> *)&zero);
    Shader::setMat4(&opaqueShader,&local_3b8,&view);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"pre_view",(allocator<char> *)&zero);
    Shader::setMat4(&opaqueShader,&local_3b8,&pre_view);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"CameraPos",(allocator<char> *)&zero);
    p_Var6 = glad_glUniform3fv;
    pCVar4 = WindowConfig::mainCamera;
    GVar8 = (*glad_glGetUniformLocation)(opaqueShader.Program,local_3b8._M_dataplus._M_p);
    (*p_Var6)(GVar8,1,(GLfloat *)pCVar4);
    std::__cxx11::string::~string((string *)&local_3b8);
    Model::Update(&glTF_model,(double)local_378);
    Model::Render(&glTF_model,&opaqueShader);
    (*glad_glBindFramebuffer)(0x8d40,0);
    (*glad_glBindTexture)(0xde1,headPtrTex);
    (*glad_glTexSubImage2D)
              (0xde1,0,0,0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,0x8d94,0x1405,
               headPtrClear.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    zero = 0;
    (*glad_glBindBuffer)(0x92c0,buffers[0]);
    (*glad_glBufferSubData)(0x92c0,0,4,(allocator<char> *)&zero);
    (*glad_glBindFramebuffer)(0x8ca8,multisampledFBO);
    (*glad_glBindFramebuffer)(0x8ca9,0);
    (*glad_glBlitFramebuffer)
              (0,0,WindowConfig::SCR_WIDTH,WindowConfig::SCR_HEIGHT,0,0,WindowConfig::SCR_WIDTH,
               WindowConfig::SCR_HEIGHT,0x100,0x2600);
    (*glad_glBindFramebuffer)(0x8ca8,0);
    (*glad_glBindFramebuffer)(0x8ca9,0);
    (*glad_glClear)(0x4000);
    (*glad_glDepthMask)('\0');
    Shader::Use(&transparentShader);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"view",&local_3d1);
    Shader::setMat4(&transparentShader,&local_3b8,&view);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"pre_view",&local_3d1);
    Shader::setMat4(&transparentShader,&local_3b8,&pre_view);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"CameraPos",&local_3d1);
    p_Var6 = glad_glUniform3fv;
    pCVar4 = WindowConfig::mainCamera;
    GVar8 = (*glad_glGetUniformLocation)(transparentShader.Program,local_3b8._M_dataplus._M_p);
    (*p_Var6)(GVar8,1,(GLfloat *)pCVar4);
    std::__cxx11::string::~string((string *)&local_3b8);
    (*glad_glBindBufferBase)(0x92c0,0,buffers[0]);
    (*glad_glBindBufferBase)(0x90d2,0,buffers[1]);
    (*glad_glBindImageTexture)(0,headPtrTex,0,'\0',0,0x88ba,0x8236);
    Model::RenderTransparent(&glTF_model,&transparentShader);
    (*glad_glDepthMask)('\x01');
    (*glad_glClear)(0x100);
    Shader::Use(&postProcessingShader);
    (*glad_glBindBufferBase)(0x90d2,0,buffers[1]);
    (*glad_glBindImageTexture)(0,headPtrTex,0,'\0',0,0x88ba,0x8236);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glBindTexture)(0x9100,multisampleTex);
    RenderQuad();
    glfwSwapBuffers(WindowConfig::window);
  }
  Model::CleanupModel(&glTF_model);
  (*glad_glDeleteProgram)(opaqueShader.Program);
  (*glad_glDeleteProgram)(postProcessingShader.Program);
  (*glad_glDeleteTextures)(1,&multisampleTex);
  (*glad_glDeleteTextures)(1,&multisampleDepth);
  (*glad_glDeleteFramebuffers)(1,&multisampledFBO);
  (*glad_glDeleteBuffers)(2,buffers);
  (*glad_glDeleteTextures)(1,&headPtrTex);
  Shader::~Shader(&postProcessingShader);
  Shader::~Shader(&transparentShader);
  Shader::~Shader(&opaqueShader);
  Model::~Model(&glTF_model);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&headPtrClear.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void RenderLoop()
{
    GLenum err;
    GLuint multisampledFBO;
    glGenFramebuffers(1, &multisampledFBO);
    glBindFramebuffer(GL_FRAMEBUFFER, multisampledFBO);
    GLuint multisampleTex;
    glGenTextures(1, &multisampleTex);
    glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, multisampleTex);
    glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_RGBA32F, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, GL_TRUE);
    glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, multisampleTex, 0);
    GLuint multisampleDepth;
    glGenRenderbuffers(1, &multisampleDepth);
    glBindRenderbuffer(GL_RENDERBUFFER, multisampleDepth);
    glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_DEPTH24_STENCIL8, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT);
    glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, multisampleDepth);
    // - Finally check if framebuffer is complete
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
    {
        std::cout << "Framebuffer not complete!" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    // OIT buffers
    const int COUNTER_BUFFER = 0;
    const int LINKED_LIST_BUFFER = 1;
    GLuint NUM_NODES = 16 * WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT;
    GLint SIZE_NODE = 5 * sizeof(GLfloat) + sizeof(GLuint); // The size of a linked list node
    // Our atomic counter
    GLuint buffers[2];
    glGenBuffers(2, buffers);
    glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffers[COUNTER_BUFFER]);
    glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
    // The buffer of linked lists
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[LINKED_LIST_BUFFER]);
    glBufferData(GL_SHADER_STORAGE_BUFFER, NUM_NODES * SIZE_NODE, NULL, GL_DYNAMIC_DRAW);

    // The buffer for the head pointers, as an image texture
    GLuint headPtrTex;
    glGenTextures(1, &headPtrTex);
    glBindTexture(GL_TEXTURE_2D, headPtrTex);
    glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT);

    vector<GLuint> headPtrClear(WindowConfig::SCR_WIDTH * WindowConfig::SCR_HEIGHT, 0xffffffff);
    // GLuint clearBuf;
    // glGenBuffers(1, &clearBuf);
    // glBindBuffer(GL_PIXEL_UNPACK_BUFFER, clearBuf);
    // glBufferData(GL_PIXEL_UNPACK_BUFFER, headPtrClear.size() * sizeof(GLuint), &headPtrClear[0], GL_STREAM_DRAW);

    mat4 view, pre_view;
    mat4 projection = glm::perspective(WindowConfig::mainCamera->Zoom,
                                       (float)WindowConfig::SCR_WIDTH / (float)WindowConfig::SCR_HEIGHT,
                                       NEAR, FAR);
    Model glTF_model(glTF_model_path);
    Shader opaqueShader("../shaders/skin/opaque.vert", "../shaders/skin/opaque.frag");
    opaqueShader.Use();
    opaqueShader.setMat4("projection", projection);

    Shader transparentShader("../shaders/skin/transparent.vert", "../shaders/skin/transparent.frag");
    transparentShader.Use();
    transparentShader.setInt("MAX_NODES", NUM_NODES);
    transparentShader.setMat4("projection", projection);

    Shader postProcessingShader("../shaders/skin/postprocessing.vert", "../shaders/skin/postprocessing.frag");
    postProcessingShader.Use();
    postProcessingShader.setInt("MAX_NODES", NUM_NODES);
    postProcessingShader.setInt("colorTextureMS", 0);

    while ((err = glGetError()) != GL_NO_ERROR)
    {
        cout << "Before Start" << hex << showbase << err << endl;
    }
    static float deltaTime(0.0f); //        float attenuation = 1.0 / (distance * distance);
    static float lastFrame(0.0f);
    while (!glfwWindowShouldClose(WindowConfig::window))
    {
        GLfloat currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        // Movement System
        glfwPollEvents();
        Controller::Movement(deltaTime);
        pre_view = view;
        view = WindowConfig::mainCamera->GetViewMatrix();
        // Render model
        glBindFramebuffer(GL_FRAMEBUFFER, multisampledFBO);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        opaqueShader.Use();
        opaqueShader.setMat4("view", view);
        opaqueShader.setMat4("pre_view", pre_view);
        opaqueShader.setVec3("CameraPos", WindowConfig::mainCamera->Position);
        glTF_model.Update(currentFrame);
        glTF_model.Render(opaqueShader);
        // glTF_model.RenderTransparent(opaqueShader);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);
        // // Clear OIT buffers
        // glBindBuffer(GL_PIXEL_UNPACK_BUFFER, clearBuf);
        glBindTexture(GL_TEXTURE_2D, headPtrTex);
        glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, GL_RED_INTEGER, GL_UNSIGNED_INT, headPtrClear.data());
        GLuint zero = 0;
        glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffers[COUNTER_BUFFER]);
        glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint), &zero);
        // Blit
        glBindFramebuffer(GL_READ_FRAMEBUFFER, multisampledFBO);
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
        glBlitFramebuffer(0, 0, WindowConfig::SCR_WIDTH, WindowConfig::SCR_HEIGHT, 
                          0, 0, WindowConfig::SCR_WIDTH,  WindowConfig::SCR_HEIGHT, GL_DEPTH_BUFFER_BIT, GL_NEAREST);
        glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
        // Render Transparent
        glClear(GL_COLOR_BUFFER_BIT);
        glDepthMask(GL_FALSE);
        transparentShader.Use();
        transparentShader.setMat4("view", view);
        transparentShader.setMat4("pre_view", pre_view);
        transparentShader.setVec3("CameraPos", WindowConfig::mainCamera->Position);
        glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, buffers[COUNTER_BUFFER]);
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffers[LINKED_LIST_BUFFER]);
        glBindImageTexture(0, headPtrTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
        glTF_model.RenderTransparent(transparentShader);
        glDepthMask(GL_TRUE);
        // Render screen
        glClear(GL_DEPTH_BUFFER_BIT);
        postProcessingShader.Use();
        glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffers[LINKED_LIST_BUFFER]);
        glBindImageTexture(0, headPtrTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, multisampleTex);
        RenderQuad();

        // Swap the screen buffers, Check and call events
        glfwSwapBuffers(WindowConfig::window);
    }
    // Release
    glTF_model.CleanupModel();
    opaqueShader.Release();
    postProcessingShader.Release();
    glDeleteTextures(1, &multisampleTex);
    glDeleteTextures(1, &multisampleDepth);
    glDeleteFramebuffers(1, &multisampledFBO);
    glDeleteBuffers(2, buffers);
    glDeleteTextures(1, &headPtrTex);
}